

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLinOp::AnyAverageDownAndSync
          (MLNodeLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int ratio;
  long lVar1;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *pVVar2;
  int ncomp;
  FabArray<amrex::FArrayBox> *pFVar3;
  MultiFab *S_fine;
  Periodicity *period;
  long lVar4;
  MFInfo local_268;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_240;
  long local_238;
  long local_230;
  long local_228;
  FabFactory<amrex::FArrayBox> local_220;
  IntVect local_218;
  MultiFab tmpmf;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  lVar4 = (long)(this->super_MLLinOp).m_num_amr_levels;
  local_240 = sol;
  pFVar3 = &Any::get<amrex::MultiFab>
                      ((sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                       super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4 + -1)->
            super_FabArray<amrex::FArrayBox>;
  tmpmf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
       Geometry::periodicity
                 (*(Geometry **)
                   &(this->super_MLLinOp).m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4 + -1].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>);
  FabArray<amrex::FArrayBox>::OverrideSync(pFVar3,(Periodicity *)&tmpmf);
  if (1 < lVar4) {
    local_228 = lVar4 * 0xc + -0x18;
    lVar1 = lVar4 * 8;
    do {
      pVVar2 = local_240;
      S_fine = Any::get<amrex::MultiFab>
                         ((Any *)((long)&(local_240->
                                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [0xffffffffffffffff].m_ptr._M_t.
                                         super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                         .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                         _M_head_impl + lVar1));
      local_230 = lVar1 + -8;
      pFVar3 = &Any::get<amrex::MultiFab>
                          ((Any *)((long)&((pVVar2->
                                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                           ._M_impl.super__Vector_impl_data._M_start + -1)
                                          [0xffffffffffffffff].m_ptr._M_t.
                                          super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                          _M_head_impl + lVar1))->super_FabArray<amrex::FArrayBox>;
      ratio = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [lVar4 + -2];
      local_238 = lVar4;
      amrex::coarsen((BoxArray *)&local_218,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,ratio);
      local_268.alloc = true;
      local_268._1_7_ = 0;
      local_268.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_268.arena = (Arena *)0x0;
      local_268.tags.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_220._vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
      MultiFab::MultiFab((MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>,(BoxArray *)&local_218,
                         &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                          distributionMap,ncomp,0,&local_268,&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268.tags.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      BoxArray::~BoxArray((BoxArray *)&local_218);
      average_down(S_fine,(MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>,0,ncomp,ratio);
      lVar1 = local_228;
      period = Periodicity::NonPeriodic();
      local_218.vect = (int  [3])ZEXT812(0);
      local_268.alloc = false;
      local_268._1_7_ = 0;
      local_268.arena = (Arena *)((ulong)local_268.arena & 0xffffffff00000000);
      FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                (pFVar3,&tmpmf.super_FabArray<amrex::FArrayBox>,0,0,ncomp,&local_218,
                 (IntVect *)&local_268,period,COPY,(CPC *)0x0,false);
      local_218.vect =
           (int  [3])
           Geometry::periodicity
                     (*(Geometry **)
                       ((long)&(((this->super_MLLinOp).m_geom.
                                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar1 * 2));
      FabArray<amrex::FArrayBox>::OverrideSync(pFVar3,(Periodicity *)&local_218);
      MultiFab::~MultiFab((MultiFab *)&tmpmf.super_FabArray<amrex::FArrayBox>);
      lVar4 = local_238 + -1;
      local_228 = lVar1 + -0xc;
      lVar1 = local_230;
    } while (1 < lVar4);
  }
  return;
}

Assistant:

void
MLNodeLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    const int ncomp = getNComp();
    const int finest_amr_lev = NAMRLevels() - 1;

    nodalSync(finest_amr_lev, 0, sol[finest_amr_lev].get<MultiFab>());

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        const auto& fmf = sol[falev  ].get<MultiFab>();
        auto&       cmf = sol[falev-1].get<MultiFab>();

        auto rr = AMRRefRatio(falev-1);
        MultiFab tmpmf(amrex::coarsen(fmf.boxArray(), rr), fmf.DistributionMap(), ncomp, 0);
        amrex::average_down(fmf, tmpmf, 0, ncomp, rr);
        cmf.ParallelCopy(tmpmf, 0, 0, ncomp);
        nodalSync(falev-1, 0, cmf);
    }
}